

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

boolean jtransform_parse_crop_spec(jpeg_transform_info *info,char *spec)

{
  char cVar1;
  boolean bVar2;
  ushort **ppuVar3;
  char *pcVar4;
  JDIMENSION JVar5;
  char *in_RSI;
  JDIMENSION *in_RDI;
  char *local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  in_RDI[4] = 0;
  in_RDI[7] = 0;
  in_RDI[9] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xd] = 0;
  ppuVar3 = __ctype_b_loc();
  local_18 = in_RSI;
  if (((*ppuVar3)[(int)*in_RSI] & 0x800) != 0) {
    bVar2 = jt_read_integer((char **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            in_RDI);
    if (bVar2 == 0) {
      return 0;
    }
    if ((*in_RSI == 'f') || (*in_RSI == 'F')) {
      local_18 = in_RSI + 1;
      in_RDI[7] = 3;
    }
    else if ((*in_RSI == 'r') || (*in_RSI == 'R')) {
      local_18 = in_RSI + 1;
      in_RDI[7] = 4;
    }
    else {
      in_RDI[7] = 1;
    }
  }
  if ((*local_18 == 'x') || (*local_18 == 'X')) {
    pcVar4 = local_18 + 1;
    bVar2 = jt_read_integer((char **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            in_RDI);
    if (bVar2 == 0) {
      return 0;
    }
    if ((*pcVar4 == 'f') || (*pcVar4 == 'F')) {
      in_RDI[9] = 3;
      local_18 = local_18 + 2;
    }
    else if ((*pcVar4 == 'r') || (*pcVar4 == 'R')) {
      in_RDI[9] = 4;
      local_18 = local_18 + 2;
    }
    else {
      in_RDI[9] = 1;
      local_18 = pcVar4;
    }
  }
  if ((*local_18 == '+') || (*local_18 == '-')) {
    JVar5 = 1;
    if (*local_18 == '-') {
      JVar5 = 2;
    }
    in_RDI[0xb] = JVar5;
    local_18 = local_18 + 1;
    bVar2 = jt_read_integer((char **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            in_RDI);
    if (bVar2 == 0) {
      return 0;
    }
  }
  if ((*local_18 == '+') || (*local_18 == '-')) {
    JVar5 = 1;
    if (*local_18 == '-') {
      JVar5 = 2;
    }
    in_RDI[0xd] = JVar5;
    local_18 = local_18 + 1;
    bVar2 = jt_read_integer((char **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            in_RDI);
    if (bVar2 == 0) {
      return 0;
    }
  }
  cVar1 = *local_18;
  if (cVar1 == '\0') {
    in_RDI[4] = 1;
  }
  return (uint)(cVar1 == '\0');
}

Assistant:

GLOBAL(boolean)
jtransform_parse_crop_spec(jpeg_transform_info *info, const char *spec)
{
  info->crop = FALSE;
  info->crop_width_set = JCROP_UNSET;
  info->crop_height_set = JCROP_UNSET;
  info->crop_xoffset_set = JCROP_UNSET;
  info->crop_yoffset_set = JCROP_UNSET;

  if (isdigit(*spec)) {
    /* fetch width */
    if (!jt_read_integer(&spec, &info->crop_width))
      return FALSE;
    if (*spec == 'f' || *spec == 'F') {
      spec++;
      info->crop_width_set = JCROP_FORCE;
    } else if (*spec == 'r' || *spec == 'R') {
      spec++;
      info->crop_width_set = JCROP_REFLECT;
    } else
      info->crop_width_set = JCROP_POS;
  }
  if (*spec == 'x' || *spec == 'X') {
    /* fetch height */
    spec++;
    if (!jt_read_integer(&spec, &info->crop_height))
      return FALSE;
    if (*spec == 'f' || *spec == 'F') {
      spec++;
      info->crop_height_set = JCROP_FORCE;
    } else if (*spec == 'r' || *spec == 'R') {
      spec++;
      info->crop_height_set = JCROP_REFLECT;
    } else
      info->crop_height_set = JCROP_POS;
  }
  if (*spec == '+' || *spec == '-') {
    /* fetch xoffset */
    info->crop_xoffset_set = (*spec == '-') ? JCROP_NEG : JCROP_POS;
    spec++;
    if (!jt_read_integer(&spec, &info->crop_xoffset))
      return FALSE;
  }
  if (*spec == '+' || *spec == '-') {
    /* fetch yoffset */
    info->crop_yoffset_set = (*spec == '-') ? JCROP_NEG : JCROP_POS;
    spec++;
    if (!jt_read_integer(&spec, &info->crop_yoffset))
      return FALSE;
  }
  /* We had better have gotten to the end of the string. */
  if (*spec != '\0')
    return FALSE;
  info->crop = TRUE;
  return TRUE;
}